

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lincost.cc
# Opt level: O0

size_t __thiscall bsplib::LinCost::get_bruck_vol(LinCost *this)

{
  value_type vVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  double dVar7;
  undefined4 uVar12;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar14 [16];
  size_t next_m;
  double cost;
  size_t m;
  size_t i_1;
  long lStack_60;
  int logP;
  size_t relation;
  size_t p2p_volume;
  size_t min_m;
  double min_cost;
  uint local_34;
  uint local_30;
  uint j;
  uint i;
  uint k;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  LinCost *local_18;
  LinCost *this_local;
  undefined4 uVar13;
  
  local_18 = this;
  if (this->m_nprocs == 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->m_sizes);
    this_local = (LinCost *)*pvVar4;
  }
  else {
    local_20._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_sizes);
    _i = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_sizes);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (local_20,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         )_i);
    j = 0;
    local_30 = 0;
    while (uVar5 = (ulong)local_30, local_34 = local_30,
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_sizes),
          uVar2 = local_30, uVar5 < sVar6) {
      do {
        local_34 = uVar2 + 1;
        uVar5 = (ulong)local_34;
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_sizes);
        if (sVar6 <= uVar5) break;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_sizes,(ulong)local_30);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_sizes,(ulong)local_34);
        uVar2 = local_34;
      } while (vVar1 == *pvVar4);
      min_cost = (double)(ulong)(local_34 - local_30);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->m_counts,(value_type_conflict *)&min_cost);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_sizes,(ulong)local_30);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_sizes,(ulong)j);
      *pvVar4 = vVar1;
      j = j + 1;
      local_30 = local_34;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_sizes,(ulong)j);
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_counts);
    if (sVar6 != j) {
      __assert_fail("m_counts.size() == k",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/lincost.cc"
                    ,0x2f,"std::size_t bsplib::LinCost::get_bruck_vol()");
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_sizes,0);
    if (*pvVar4 != 0) {
      __assert_fail("m_sizes[0] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/lincost.cc"
                    ,0x30,"std::size_t bsplib::LinCost::get_bruck_vol()");
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_counts,0);
    if (*pvVar4 == 0) {
      __assert_fail("m_counts[0] >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/lincost.cc"
                    ,0x31,"std::size_t bsplib::LinCost::get_bruck_vol()");
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_counts,0);
    *pvVar4 = *pvVar4 - 1;
    min_m = (size_t)std::numeric_limits<double>::max();
    p2p_volume = 0;
    relation = 0;
    lStack_60 = 0;
    iVar3 = uint32_log2(this->m_nprocs - 1);
    m = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_sizes);
    while( true ) {
      uVar12 = (undefined4)((ulong)lStack_60 >> 0x20);
      uVar13 = (undefined4)(relation >> 0x20);
      if (m < 2) break;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_sizes,m - 1);
      vVar1 = *pvVar4;
      auVar8._8_4_ = (int)(vVar1 >> 0x20);
      auVar8._0_8_ = vVar1;
      auVar8._12_4_ = 0x45300000;
      auVar9._8_4_ = uVar12;
      auVar9._0_8_ = lStack_60;
      auVar9._12_4_ = 0x45300000;
      auVar10._8_4_ = uVar13;
      auVar10._0_8_ = relation;
      auVar10._12_4_ = 0x45300000;
      dVar7 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)relation) - 4503599627370496.0)) * this->m_beta +
              (double)(iVar3 + 1) *
              (this->m_beta * (double)this->m_nprocs *
               ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0)) + this->m_alpha) +
              ((auVar9._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lStack_60) - 4503599627370496.0)) * this->m_alpha;
      if (dVar7 < (double)min_m) {
        p2p_volume = vVar1;
        min_m = (size_t)dVar7;
      }
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_counts,m - 1);
      lStack_60 = *pvVar4 + lStack_60;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_sizes,m - 2);
      relation = lStack_60 * (vVar1 - *pvVar4) + relation;
      m = m - 1;
    }
    reset(this,this->m_nprocs);
    auVar14._8_4_ = uVar12;
    auVar14._0_8_ = lStack_60;
    auVar14._12_4_ = 0x45300000;
    auVar11._8_4_ = uVar13;
    auVar11._0_8_ = relation;
    auVar11._12_4_ = 0x45300000;
    if ((double)min_m <=
        ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lStack_60) - 4503599627370496.0)) * this->m_alpha +
        ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)relation) - 4503599627370496.0)) * this->m_beta) {
      this_local = (LinCost *)p2p_volume;
    }
    else {
      this_local = (LinCost *)0x0;
    }
  }
  return (size_t)this_local;
}

Assistant:

std::size_t LinCost::get_bruck_vol()
{
    if ( m_nprocs == 1 ) return m_sizes.back();

    // Make sure the list m_sizes consists of unique numbers, sorted in
    // increasing order, while m_counts contains the multiplicity
    std::sort( m_sizes.begin(), m_sizes.end() );
    unsigned k = 0;
    for ( unsigned i = 0, j=0; i < m_sizes.size(); i=j ) {

        for (j=i+1 ; j < m_sizes.size(); ++j ) 
            if ( m_sizes[i] != m_sizes[j] )
                break;

        m_counts.push_back( j-i );
        m_sizes[k] = m_sizes[i];
        k++;
    }
    m_sizes.resize(k);
    assert( m_counts.size() == k );
    assert( m_sizes[0] == 0 );
    assert( m_counts[0] >= 1);
    m_counts[0] -= 1; // remove one occurrence of zero


    // now we can find the minimum cost
    double min_cost = std::numeric_limits<double>::max();
    std::size_t min_m = 0;
    std::size_t p2p_volume = 0, relation = 0;
    int logP = 1 + int_log2( m_nprocs-1 );
    for ( std::size_t i = m_sizes.size(); i > 1; --i ) {
        std::size_t m = m_sizes[i-1];

        double cost = logP * ( m_alpha + m_beta * m_nprocs * m ) + 
            relation * m_alpha + p2p_volume * m_beta;

        if (cost < min_cost) {
            min_cost = cost;
            min_m = m;
        }

        relation += m_counts[i-1];
        std::size_t next_m = m_sizes[i-2];
        p2p_volume += relation * (m - next_m);
    }
    reset(m_nprocs);
    // now test for m = zero
    if ( relation * m_alpha + p2p_volume * m_beta < min_cost ) {
        return 0;
    }
    return min_m;
}